

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O1

int mbedtls_aes_crypt_xts
              (mbedtls_aes_xts_context *ctx,int mode,size_t length,uchar *data_unit,uchar *input,
              uchar *output)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  uchar *puVar7;
  ulong uVar8;
  bool bVar9;
  uchar tmp [16];
  uchar tweak [16];
  uchar prev_tweak [16];
  byte local_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar1 = -0x22;
  if ((0xffffffffff00000e < length - 0x1000001) &&
     (iVar1 = mbedtls_aes_crypt_ecb(&ctx->tweak,1,data_unit,(uchar *)&local_58), iVar1 == 0)) {
    uVar8 = (ulong)((uint)length & 0xf);
    uVar6 = length >> 4;
    iVar1 = 0;
    while( true ) {
      bVar9 = uVar6 == 0;
      uVar6 = uVar6 - 1;
      if (bVar9) break;
      if (uVar6 == 0 && (mode == 0 && uVar8 != 0)) {
        local_48 = local_58;
        uStack_40 = uStack_50;
        mbedtls_gf128mul_x_ble((uchar *)&local_58,(uchar *)&local_58);
      }
      lVar3 = 0;
      do {
        local_68[lVar3] = *(byte *)((long)&local_58 + lVar3) ^ input[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x10);
      iVar2 = mbedtls_aes_crypt_ecb(&ctx->crypt,mode,local_68,local_68);
      iVar5 = iVar2;
      if (iVar2 == 0) {
        lVar3 = 0;
        do {
          output[lVar3] = *(byte *)((long)&local_58 + lVar3) ^ local_68[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x10);
        mbedtls_gf128mul_x_ble((uchar *)&local_58,(uchar *)&local_58);
        output = output + 0x10;
        input = input + 0x10;
        iVar5 = iVar1;
      }
      iVar1 = iVar5;
      if (iVar2 != 0) {
        return iVar1;
      }
    }
    if (uVar8 != 0) {
      puVar7 = (uchar *)&local_58;
      if (mode == 0) {
        puVar7 = (uchar *)&local_48;
      }
      uVar6 = 0;
      do {
        uVar4 = uVar6;
        output[uVar4] = output[uVar4 - 0x10];
        local_68[uVar4] = puVar7[uVar4] ^ input[uVar4];
        uVar6 = uVar4 + 1;
      } while (uVar8 != uVar6);
      if (uVar4 < 0xf) {
        uVar8 = uVar8 | 0xfffffffffffffff0;
        do {
          local_68[uVar6] = puVar7[uVar6] ^ output[uVar6 - 0x10];
          uVar6 = uVar6 + 1;
          uVar8 = uVar8 + 1;
        } while (uVar8 != 0);
      }
      iVar2 = mbedtls_aes_crypt_ecb(&ctx->crypt,mode,local_68,local_68);
      iVar5 = iVar2;
      if (iVar2 == 0) {
        lVar3 = 0;
        do {
          output[lVar3 + -0x10] = puVar7[lVar3] ^ local_68[lVar3];
          lVar3 = lVar3 + 1;
          iVar5 = iVar1;
        } while (lVar3 != 0x10);
      }
      if (iVar2 != 0) {
        return iVar5;
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mbedtls_aes_crypt_xts( mbedtls_aes_xts_context *ctx,
                           int mode,
                           size_t length,
                           const unsigned char data_unit[16],
                           const unsigned char *input,
                           unsigned char *output )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t blocks = length / 16;
    size_t leftover = length % 16;
    unsigned char tweak[16];
    unsigned char prev_tweak[16];
    unsigned char tmp[16];

    AES_VALIDATE_RET( ctx != NULL );
    AES_VALIDATE_RET( mode == MBEDTLS_AES_ENCRYPT ||
                      mode == MBEDTLS_AES_DECRYPT );
    AES_VALIDATE_RET( data_unit != NULL );
    AES_VALIDATE_RET( input != NULL );
    AES_VALIDATE_RET( output != NULL );

    /* Data units must be at least 16 bytes long. */
    if( length < 16 )
        return MBEDTLS_ERR_AES_INVALID_INPUT_LENGTH;

    /* NIST SP 800-38E disallows data units larger than 2**20 blocks. */
    if( length > ( 1 << 20 ) * 16 )
        return MBEDTLS_ERR_AES_INVALID_INPUT_LENGTH;

    /* Compute the tweak. */
    ret = mbedtls_aes_crypt_ecb( &ctx->tweak, MBEDTLS_AES_ENCRYPT,
                                 data_unit, tweak );
    if( ret != 0 )
        return( ret );

    while( blocks-- )
    {
        size_t i;

        if( leftover && ( mode == MBEDTLS_AES_DECRYPT ) && blocks == 0 )
        {
            /* We are on the last block in a decrypt operation that has
             * leftover bytes, so we need to use the next tweak for this block,
             * and this tweak for the lefover bytes. Save the current tweak for
             * the leftovers and then update the current tweak for use on this,
             * the last full block. */
            memcpy( prev_tweak, tweak, sizeof( tweak ) );
            mbedtls_gf128mul_x_ble( tweak, tweak );
        }

        for( i = 0; i < 16; i++ )
            tmp[i] = input[i] ^ tweak[i];

        ret = mbedtls_aes_crypt_ecb( &ctx->crypt, mode, tmp, tmp );
        if( ret != 0 )
            return( ret );

        for( i = 0; i < 16; i++ )
            output[i] = tmp[i] ^ tweak[i];

        /* Update the tweak for the next block. */
        mbedtls_gf128mul_x_ble( tweak, tweak );

        output += 16;
        input += 16;
    }

    if( leftover )
    {
        /* If we are on the leftover bytes in a decrypt operation, we need to
         * use the previous tweak for these bytes (as saved in prev_tweak). */
        unsigned char *t = mode == MBEDTLS_AES_DECRYPT ? prev_tweak : tweak;

        /* We are now on the final part of the data unit, which doesn't divide
         * evenly by 16. It's time for ciphertext stealing. */
        size_t i;
        unsigned char *prev_output = output - 16;

        /* Copy ciphertext bytes from the previous block to our output for each
         * byte of cyphertext we won't steal. At the same time, copy the
         * remainder of the input for this final round (since the loop bounds
         * are the same). */
        for( i = 0; i < leftover; i++ )
        {
            output[i] = prev_output[i];
            tmp[i] = input[i] ^ t[i];
        }

        /* Copy ciphertext bytes from the previous block for input in this
         * round. */
        for( ; i < 16; i++ )
            tmp[i] = prev_output[i] ^ t[i];

        ret = mbedtls_aes_crypt_ecb( &ctx->crypt, mode, tmp, tmp );
        if( ret != 0 )
            return ret;

        /* Write the result back to the previous block, overriding the previous
         * output we copied. */
        for( i = 0; i < 16; i++ )
            prev_output[i] = tmp[i] ^ t[i];
    }

    return( 0 );
}